

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_OES_texture_cube_map(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_OES_texture_cube_map != 0) {
    glad_glTexGenfOES = (PFNGLTEXGENFOESPROC)(*load)("glTexGenfOES");
    glad_glTexGenfvOES = (PFNGLTEXGENFVOESPROC)(*load)("glTexGenfvOES");
    glad_glTexGeniOES = (PFNGLTEXGENIOESPROC)(*load)("glTexGeniOES");
    glad_glTexGenivOES = (PFNGLTEXGENIVOESPROC)(*load)("glTexGenivOES");
    glad_glTexGenxOES = (PFNGLTEXGENXOESPROC)(*load)("glTexGenxOES");
    glad_glTexGenxvOES = (PFNGLTEXGENXVOESPROC)(*load)("glTexGenxvOES");
    glad_glGetTexGenfvOES = (PFNGLGETTEXGENFVOESPROC)(*load)("glGetTexGenfvOES");
    glad_glGetTexGenivOES = (PFNGLGETTEXGENIVOESPROC)(*load)("glGetTexGenivOES");
    glad_glGetTexGenxvOES = (PFNGLGETTEXGENXVOESPROC)(*load)("glGetTexGenxvOES");
  }
  return;
}

Assistant:

static void load_GL_OES_texture_cube_map(GLADloadproc load) {
	if(!GLAD_GL_OES_texture_cube_map) return;
	glad_glTexGenfOES = (PFNGLTEXGENFOESPROC)load("glTexGenfOES");
	glad_glTexGenfvOES = (PFNGLTEXGENFVOESPROC)load("glTexGenfvOES");
	glad_glTexGeniOES = (PFNGLTEXGENIOESPROC)load("glTexGeniOES");
	glad_glTexGenivOES = (PFNGLTEXGENIVOESPROC)load("glTexGenivOES");
	glad_glTexGenxOES = (PFNGLTEXGENXOESPROC)load("glTexGenxOES");
	glad_glTexGenxvOES = (PFNGLTEXGENXVOESPROC)load("glTexGenxvOES");
	glad_glGetTexGenfvOES = (PFNGLGETTEXGENFVOESPROC)load("glGetTexGenfvOES");
	glad_glGetTexGenivOES = (PFNGLGETTEXGENIVOESPROC)load("glGetTexGenivOES");
	glad_glGetTexGenxvOES = (PFNGLGETTEXGENXVOESPROC)load("glGetTexGenxvOES");
}